

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O1

IterateResult __thiscall
gl3cts::GPUShader5FunctionOverloadingTest::iterate(GPUShader5FunctionOverloadingTest *this)

{
  GPUShader5ImplicitConversionsTest::testInit(&this->super_GPUShader5ImplicitConversionsTest);
  execute(this,iterate::u1_data_1,iterate::u2_data_1,true);
  execute(this,iterate::u1_data_2,iterate::u2_data_2,false);
  tcu::TestContext::setTestResult
            (((this->super_GPUShader5ImplicitConversionsTest).super_TestCase.m_context)->m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5FunctionOverloadingTest::iterate()
{
	/* Defines data used as u1 and u2 uniforms */
	static const glw::GLint  u1_data_1[4] = { (glw::GLint)0xffff0000, 0x0000ffff, 0x00ffffff, (glw::GLint)0xffffffff };
	static const glw::GLint  u1_data_2[4] = { -112, 1122, -111222, 1222111222 };
	static const glw::GLuint u2_data_1[4] = { 0xffff0000, 0x0000ffff, 0x00ffffff, 0xffffffff };
	static const glw::GLuint u2_data_2[4] = { 0xfff70000, 0x00007fff, 0x007fffff, 0xfffffff7 };

	testInit();

	/* Execute test case */
	execute(u1_data_1, u2_data_1, true);
	execute(u1_data_2, u2_data_2, false);

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}